

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v7::detail::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint64_t value;
  bigint *lhs2;
  ulong uVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint denominator;
  bigint *local_320;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00129d20;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00129d20;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00129d20;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_320 = &local_190;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00129d20;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  uVar7 = (ulong)d & 0xfffffffffffff;
  uVar4 = (uint)((ulong)d >> 0x34) & 0x7ff;
  uVar8 = uVar7 + 0x10000000000000;
  if (uVar4 == 0) {
    uVar8 = uVar7;
  }
  iVar6 = -0x432;
  if (uVar4 != 0) {
    iVar6 = uVar4 - 0x433;
  }
  bVar12 = uVar7 == 0;
  bVar11 = 1 < uVar4;
  iVar10 = (bVar11 && bVar12) + 1;
  value = uVar8 << (sbyte)iVar10;
  if (iVar6 < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      sVar2 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_240.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_240,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_240.bigits_.super_buffer<unsigned_int>.size_ =
           local_240.bigits_.super_buffer<unsigned_int>.capacity_;
      if (sVar2 <= local_240.bigits_.super_buffer<unsigned_int>.capacity_) {
        local_240.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
      }
      if (sVar2 != 0) {
        memmove(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar2 << 2);
      }
      sVar2 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      local_240.exp_ = local_2f0.exp_;
      if (bVar11 && bVar12) {
        if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_190,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_190.bigits_.super_buffer<unsigned_int>.size_ =
             local_190.bigits_.super_buffer<unsigned_int>.capacity_;
        if (sVar2 <= local_190.bigits_.super_buffer<unsigned_int>.capacity_) {
          local_190.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
        }
        if (sVar2 != 0) {
          memmove(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar2 << 2);
        }
        local_320 = &local_190;
        local_190.exp_ = local_2f0.exp_;
        bigint::operator<<=(local_320,1);
      }
      else {
        local_320 = (bigint *)0x0;
      }
      bigint::operator*=(&local_2f0,value);
      bigint::assign(&local_e0,1);
      bigint::operator<<=(&local_e0,iVar10 - iVar6);
    }
    else {
      bigint::assign(&local_2f0,value);
      bigint::assign_pow10(&local_e0,*exp10);
      bigint::operator<<=(&local_e0,iVar10 - iVar6);
      bigint::assign(&local_240,1);
      if (bVar11 && bVar12) {
        bigint::assign(&local_190,2);
      }
      else {
        local_320 = (bigint *)0x0;
      }
    }
  }
  else {
    bigint::assign(&local_2f0,value);
    bigint::operator<<=(&local_2f0,iVar6);
    bigint::assign(&local_240,1);
    bigint::operator<<=(&local_240,iVar6);
    if (bVar11 && bVar12) {
      local_320 = &local_190;
      bigint::assign(local_320,1);
      bigint::operator<<=(&local_190,iVar6 + 1);
    }
    else {
      local_320 = (bigint *)0x0;
    }
    bigint::assign_pow10(&local_e0,*exp10);
    bigint::operator<<=(&local_e0,1);
  }
  lhs2 = local_320;
  if (local_320 == (bigint *)0x0) {
    lhs2 = &local_240;
  }
  pcVar1 = buf->ptr_;
  uVar4 = ~(uint)uVar8 & 1;
  lVar9 = 0;
  while( true ) {
    uVar5 = bigint::divmod_assign(&local_2f0,&local_e0);
    iVar6 = compare(&local_2f0,&local_240);
    iVar10 = add_compare(&local_2f0,lhs2,&local_e0);
    pcVar1[lVar9] = (char)uVar5 + '0';
    if ((iVar6 < (int)uVar4) || ((int)-uVar4 < iVar10)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_240,10);
    if (local_320 != (bigint *)0x0) {
      bigint::multiply(lhs2,10);
    }
    lVar9 = lVar9 + 1;
  }
  if (iVar6 < (int)uVar4) {
    if (iVar10 <= (int)-uVar4) goto LAB_00113521;
    iVar6 = add_compare(&local_2f0,&local_2f0,&local_e0);
    if ((iVar6 < 1) && ((uVar5 & 1) == 0 || iVar6 != 0)) goto LAB_00113521;
    cVar3 = pcVar1[lVar9] + '\x01';
  }
  else {
    cVar3 = (char)uVar5 + '1';
  }
  pcVar1[lVar9] = cVar3;
LAB_00113521:
  uVar8 = lVar9 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar8) {
    (**buf->_vptr_buffer)(buf,uVar8);
  }
  if (buf->capacity_ < uVar8) {
    uVar8 = buf->capacity_;
  }
  buf->size_ = uVar8;
  *exp10 = *exp10 - (int)lVar9;
  bigint::~bigint(&local_190);
  bigint::~bigint(&local_240);
  bigint::~bigint(&local_e0);
  bigint::~bigint(&local_2f0);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.try_resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}